

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O0

void __thiscall CountAggregate::createAggregateRegister(CountAggregate *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  void *pvVar10;
  element_type *peVar11;
  DTreeNode *pDVar12;
  long in_RDI;
  DTreeNode *in_stack_00000038;
  CountAggregate *in_stack_00000040;
  size_t attID_1;
  size_t attID;
  int numOfChildren;
  size_t i;
  void *in_stack_ffffffffffffff50;
  int index;
  DTree *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff68;
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  *in_stack_ffffffffffffff70;
  ulong local_28;
  ulong local_20;
  ulong local_10;
  
  std::
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ::resize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES << 2;
  uVar9 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  memset(pvVar10,0,uVar9);
  *(void **)(in_RDI + 0xe8) = pvVar10;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar9 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  memset(pvVar10,0,uVar9);
  *(void **)(in_RDI + 0xe0) = pvVar10;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar9 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  *(void **)(in_RDI + 0xa0) = pvVar10;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES;
  uVar9 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  *(void **)(in_RDI + 0xa8) = pvVar10;
  uVar9 = dfdb::params::NUM_OF_ATTRIBUTES;
  pvVar10 = operator_new__(dfdb::params::NUM_OF_ATTRIBUTES);
  memset(pvVar10,0,uVar9);
  *(void **)(in_RDI + 0xf0) = pvVar10;
  uVar9 = dfdb::params::NUM_OF_ATTRIBUTES;
  pvVar10 = operator_new__(dfdb::params::NUM_OF_ATTRIBUTES);
  memset(pvVar10,0,uVar9);
  *(void **)(in_RDI + 0xf8) = pvVar10;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES + 1;
  uVar9 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  memset(pvVar10,0,uVar9);
  *(void **)(in_RDI + 0x100) = pvVar10;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dfdb::params::NUM_OF_FEATURES;
  uVar9 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  memset(pvVar10,0,uVar9);
  *(void **)(in_RDI + 0x78) = pvVar10;
  for (local_10 = 0; local_10 < dfdb::params::NUM_OF_ATTRIBUTES; local_10 = local_10 + 1) {
    uVar9 = local_10;
    peVar11 = std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x198075);
    index = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
    if (uVar9 != (long)peVar11->_root->_id) {
      std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1980a1);
      pDVar12 = DTree::getNode(in_stack_ffffffffffffff58,index);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (long)(pDVar12->_parent->_numOfChildren + 2);
      uVar9 = SUB168(auVar7 * ZEXT816(4),0);
      if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
        uVar9 = 0xffffffffffffffff;
      }
      in_stack_ffffffffffffff50 = operator_new__(uVar9);
      memset(in_stack_ffffffffffffff50,0,uVar9);
      *(void **)(*(long *)(in_RDI + 0xa0) + local_10 * 8) = in_stack_ffffffffffffff50;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dfdb::params::NUM_OF_ATTRIBUTES + 1;
      in_stack_ffffffffffffff58 = SUB168(auVar8 * ZEXT816(4),0);
      if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
        in_stack_ffffffffffffff58 = (DTree *)0xffffffffffffffff;
      }
      pvVar10 = operator_new__((ulong)in_stack_ffffffffffffff58);
      memset(pvVar10,0,(size_t)in_stack_ffffffffffffff58);
      *(void **)(*(long *)(in_RDI + 0xa8) + local_10 * 8) = pvVar10;
    }
  }
  std::__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<DTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1981bc);
  registerAggregatesFromModel(in_stack_00000040,in_stack_00000038);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + dfdb::params::NUM_OF_ATTRIBUTES * 4) = 0;
  for (local_20 = 0; local_20 < dfdb::params::NUM_OF_ATTRIBUTES - 1; local_20 = local_20 + 1) {
    *(int *)(*(long *)(in_RDI + 0xe8) + 4 + (dfdb::params::NUM_OF_ATTRIBUTES + local_20) * 4) =
         *(int *)(*(long *)(in_RDI + 0xe8) + (dfdb::params::NUM_OF_ATTRIBUTES + local_20) * 4) +
         *(int *)(*(long *)(in_RDI + 0xe8) + local_20 * 4);
  }
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + dfdb::params::NUM_OF_ATTRIBUTES * 0xc) = 0;
  for (local_28 = 0; local_28 < dfdb::params::NUM_OF_ATTRIBUTES - 1; local_28 = local_28 + 1) {
    *(int *)(*(long *)(in_RDI + 0xe8) + 4 + (dfdb::params::NUM_OF_ATTRIBUTES * 3 + local_28) * 4) =
         *(int *)(*(long *)(in_RDI + 0xe8) + (dfdb::params::NUM_OF_ATTRIBUTES * 3 + local_28) * 4) +
         *(int *)(*(long *)(in_RDI + 0xe8) + (dfdb::params::NUM_OF_ATTRIBUTES * 2 + local_28) * 4);
  }
  return;
}

Assistant:

void CountAggregate::createAggregateRegister()
{
    _aggregateRegister.resize(NUM_OF_ATTRIBUTES);
    _lineageRegister.resize(NUM_OF_ATTRIBUTES);
    
    _numberOfAggregatesPerNode = new int[NUM_OF_ATTRIBUTES * 4]();
    _degreeOfLocalAggregates = new int[NUM_OF_ATTRIBUTES]();

    aggPlaceholder = new int*[NUM_OF_ATTRIBUTES];
    lineagePlaceholder = new int*[NUM_OF_ATTRIBUTES];

    onehotfeatures = new bool[NUM_OF_ATTRIBUTES]();
    isDetermined = new bool[NUM_OF_ATTRIBUTES]();
    determinedBy = new int[NUM_OF_ATTRIBUTES + 1]();

    /* Read in features from file and finds the labels. */
    _features = new int*[NUM_OF_FEATURES]();

    
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {        
        if (i != (size_t) _dTree->_root->_id)
        {
            int numOfChildren = _dTree->getNode(i)->_parent->_numOfChildren;
            aggPlaceholder[i] = new int[numOfChildren + 2]();
            lineagePlaceholder[i] = new int[NUM_OF_ATTRIBUTES + 1]();
        }
    }

    /* Registers aggregates to the d-tree nodes following the structure of the model. */
    registerAggregatesFromModel(_dTree->_root);

    /* Setting the upper half of _numberOfAggregatesPerNode, which provides offsets */
    _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES] = 0;
    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES - 1; ++attID)
        _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + attID + 1] =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES + attID]
            + _numberOfAggregatesPerNode[attID];

    _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3] = 0;
    for (size_t attID = 0; attID < NUM_OF_ATTRIBUTES - 1; ++attID)
        _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID + 1] =
            _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 3 + attID]
            + _numberOfAggregatesPerNode[NUM_OF_ATTRIBUTES * 2 + attID];
}